

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

QModelIndexList * __thiscall
QListView::selectedIndexes(QModelIndexList *__return_storage_ptr__,QListView *this)

{
  quintptr qVar1;
  QAbstractItemModel *pQVar2;
  int iVar3;
  undefined4 uVar4;
  quintptr qVar5;
  bool bVar6;
  char cVar7;
  iterator aend;
  iterator iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  QModelIndex *pQVar13;
  const_iterator cVar14;
  long in_FS_OFFSET;
  QModelIndex local_50;
  long local_38;
  const_iterator cVar12;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  qVar1 = *(quintptr *)
           &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
            field_0x8;
  if (((*(long *)(qVar1 + 800) == 0) || (*(int *)(*(long *)(qVar1 + 800) + 4) == 0)) ||
     (*(long *)(qVar1 + 0x328) == 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (QModelIndex *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_0056e5ed;
  }
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  QItemSelectionModel::selectedIndexes();
  pQVar13 = (__return_storage_ptr__->d).ptr;
  lVar11 = (__return_storage_ptr__->d).size;
  lVar10 = lVar11;
  cVar14.i = pQVar13;
  local_50._0_8_ = this;
  local_50.i = qVar1;
  if (0 < lVar11 >> 2) {
    lVar9 = (lVar11 >> 2) + 1;
    lVar10 = lVar11 * 0x18;
    do {
      bVar6 = __gnu_cxx::__ops::_Iter_pred<QListView::selectedIndexes()const::$_0>::operator()
                        ((_Iter_pred<QListView::selectedIndexes()const::__0> *)&local_50,cVar14);
      cVar12.i = cVar14.i;
      if (bVar6) goto LAB_0056e4e0;
      bVar6 = __gnu_cxx::__ops::_Iter_pred<QListView::selectedIndexes()const::$_0>::operator()
                        ((_Iter_pred<QListView::selectedIndexes()const::__0> *)&local_50,
                         cVar14.i + 1);
      cVar12.i = cVar14.i + 1;
      if (bVar6) goto LAB_0056e4e0;
      bVar6 = __gnu_cxx::__ops::_Iter_pred<QListView::selectedIndexes()const::$_0>::operator()
                        ((_Iter_pred<QListView::selectedIndexes()const::__0> *)&local_50,
                         cVar14.i + 2);
      cVar12.i = cVar14.i + 2;
      if (bVar6) goto LAB_0056e4e0;
      bVar6 = __gnu_cxx::__ops::_Iter_pred<QListView::selectedIndexes()const::$_0>::operator()
                        ((_Iter_pred<QListView::selectedIndexes()const::__0> *)&local_50,
                         cVar14.i + 3);
      cVar12.i = cVar14.i + 3;
      if (bVar6) goto LAB_0056e4e0;
      cVar14.i = cVar14.i + 4;
      lVar9 = lVar9 + -1;
      lVar10 = lVar10 + -0x60;
    } while (1 < lVar9);
    lVar10 = (lVar10 >> 3) * -0x5555555555555555;
  }
  if (lVar10 == 1) {
LAB_0056e4c7:
    bVar6 = __gnu_cxx::__ops::_Iter_pred<QListView::selectedIndexes()const::$_0>::operator()
                      ((_Iter_pred<QListView::selectedIndexes()const::__0> *)&local_50,cVar14);
    cVar12.i = pQVar13 + lVar11;
    if (bVar6) {
      cVar12.i = cVar14.i;
    }
  }
  else if (lVar10 == 2) {
LAB_0056e499:
    bVar6 = __gnu_cxx::__ops::_Iter_pred<QListView::selectedIndexes()const::$_0>::operator()
                      ((_Iter_pred<QListView::selectedIndexes()const::__0> *)&local_50,cVar14);
    cVar12.i = cVar14.i;
    if (!bVar6) {
      cVar14.i = cVar14.i + 1;
      goto LAB_0056e4c7;
    }
  }
  else {
    cVar12.i = pQVar13 + lVar11;
    if ((lVar10 == 3) &&
       (bVar6 = __gnu_cxx::__ops::_Iter_pred<QListView::selectedIndexes()const::$_0>::operator()
                          ((_Iter_pred<QListView::selectedIndexes()const::__0> *)&local_50,cVar14),
       cVar12.i = cVar14.i, !bVar6)) {
      cVar14.i = cVar14.i + 1;
      goto LAB_0056e499;
    }
  }
LAB_0056e4e0:
  lVar11 = (long)cVar12.i - (long)pQVar13;
  if ((lVar11 >> 3) * -0x5555555555555555 - (__return_storage_ptr__->d).size != 0) {
    aend = QList<QModelIndex>::end(__return_storage_ptr__);
    iVar8 = QList<QModelIndex>::begin(__return_storage_ptr__);
    cVar14.i = iVar8.i + lVar11;
    pQVar13 = iVar8.i + lVar11 + 0x18;
    if (pQVar13 != aend.i) {
      do {
        if (pQVar13->c == *(int *)(qVar1 + 0x590)) {
          pQVar2 = (pQVar13->m).ptr;
          if (pQVar2 == (QAbstractItemModel *)0x0) {
            local_50._0_8_ = (QListView *)0xffffffffffffffff;
            local_50.i = 0;
            local_50.m.ptr = (QAbstractItemModel *)0x0;
          }
          else {
            (**(code **)(*(long *)pQVar2 + 0x68))(&local_50,pQVar2,pQVar13);
          }
          cVar7 = comparesEqual((QPersistentModelIndex *)(qVar1 + 0x3b8),&local_50);
          if ((cVar7 != '\0') &&
             (cVar7 = (**(code **)(*(long *)&(this->super_QAbstractItemView).
                                             super_QAbstractScrollArea.super_QFrame.super_QWidget +
                                  0x2c0))(this,pQVar13), cVar7 == '\0')) {
            ((cVar14.i)->m).ptr = (pQVar13->m).ptr;
            iVar3 = pQVar13->c;
            qVar5 = pQVar13->i;
            uVar4 = *(undefined4 *)((long)&pQVar13->i + 4);
            (cVar14.i)->r = pQVar13->r;
            (cVar14.i)->c = iVar3;
            *(int *)&(cVar14.i)->i = (int)qVar5;
            *(undefined4 *)((long)&(cVar14.i)->i + 4) = uVar4;
            cVar14.i = cVar14.i + 1;
          }
        }
        pQVar13 = pQVar13 + 1;
      } while (pQVar13 != aend.i);
    }
    QList<QModelIndex>::erase(__return_storage_ptr__,cVar14,(const_iterator)aend.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0056e5ed:
  __stack_chk_fail();
}

Assistant:

QModelIndexList QListView::selectedIndexes() const
{
    Q_D(const QListView);
    if (!d->selectionModel)
        return QModelIndexList();

    QModelIndexList viewSelected = d->selectionModel->selectedIndexes();
    auto ignorable = [this, d](const QModelIndex &index) {
        return index.column() != d->column || index.parent() != d->root || isIndexHidden(index);
    };
    viewSelected.removeIf(ignorable);
    return viewSelected;
}